

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O0

_Bool ppc_pvr_match_power8(PowerPCCPUClass_conflict1 *pcc,uint32_t pvr)

{
  uint32_t pvr_local;
  PowerPCCPUClass_conflict1 *pcc_local;
  
  if ((pvr & 0xffff0000) == 0x4c0000) {
    pcc_local._7_1_ = true;
  }
  else if ((pvr & 0xffff0000) == 0x4b0000) {
    pcc_local._7_1_ = true;
  }
  else if ((pvr & 0xffff0000) == 0x4d0000) {
    pcc_local._7_1_ = true;
  }
  else {
    pcc_local._7_1_ = false;
  }
  return pcc_local._7_1_;
}

Assistant:

static bool ppc_pvr_match_power8(PowerPCCPUClass *pcc, uint32_t pvr)
{
    if ((pvr & CPU_POWERPC_POWER_SERVER_MASK) == CPU_POWERPC_POWER8NVL_BASE) {
        return true;
    }
    if ((pvr & CPU_POWERPC_POWER_SERVER_MASK) == CPU_POWERPC_POWER8E_BASE) {
        return true;
    }
    if ((pvr & CPU_POWERPC_POWER_SERVER_MASK) == CPU_POWERPC_POWER8_BASE) {
        return true;
    }
    return false;
}